

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall r_comp::Decompiler::write_expression_head(Decompiler *this,uint16_t read_index)

{
  Metadata *pMVar1;
  undefined1 uVar2;
  ushort uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  undefined6 in_register_00000032;
  char (*t_00) [4];
  OutStream *pOVar4;
  ulong i;
  long lVar5;
  
  i = CONCAT62(in_register_00000032,read_index) & 0xffffffff;
  r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),i);
  uVar2 = r_code::Atom::getDescriptor();
  switch(uVar2) {
  case 0xc3:
  case 0xc4:
    lVar5 = 0xa8;
    goto LAB_0013bde3;
  case 0xc5:
    lVar5 = 0xc0;
LAB_0013bde3:
    pMVar1 = this->metadata;
    pOVar4 = this->out_stream;
    r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),i);
    uVar3 = r_code::Atom::asOpcode();
    t = r_code::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&(pMVar1->classes)._M_h._M_buckets + lVar5),(ulong)uVar3);
    OutStream::operator<<(pOVar4,t);
    return;
  default:
    OutStream::operator<<(this->out_stream,(char (*) [16])"undefined-class");
    return;
  case 200:
    pOVar4 = this->out_stream;
    t_00 = (char (*) [4])0x146d67;
    break;
  case 0xc9:
  case 0xcb:
  case 0xcc:
    OutStream::operator<<(this->out_stream,(char (*) [5])"ipgm");
    return;
  case 0xca:
    OutStream::operator<<(this->out_stream,(char (*) [9])"icpp_pgm");
    return;
  case 0xcd:
    pOVar4 = this->out_stream;
    t_00 = (char (*) [4])0x146c53;
    break;
  case 0xce:
    pOVar4 = this->out_stream;
    t_00 = (char (*) [4])0x146c58;
  }
  OutStream::operator<<(pOVar4,t_00);
  return;
}

Assistant:

void Decompiler::write_expression_head(uint16_t read_index)
{
    switch (current_object->code[read_index].getDescriptor()) {
    case Atom::OPERATOR:
        *out_stream << metadata->operator_names[current_object->code[read_index].asOpcode()];
        break;

    case Atom::OBJECT:
    case Atom::MARKER:
        *out_stream << metadata->class_names[current_object->code[read_index].asOpcode()];
        break;

    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
        *out_stream << "ipgm";
        break;

    case Atom::INSTANTIATED_CPP_PROGRAM:
        *out_stream << "icpp_pgm";
        break;

    case Atom::COMPOSITE_STATE:
        *out_stream << "cst";
        break;

    case Atom::MODEL:
        *out_stream << "mdl";
        break;

    case Atom::GROUP:
        *out_stream << "grp";
        break;

    default:
        *out_stream << "undefined-class";
        break;
    }
}